

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O1

vector<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_> * __thiscall
anurbs::Model::of_type<anurbs::Brep>
          (vector<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>
           *__return_storage_ptr__,Model *this)

{
  int iVar1;
  size_t index;
  bool bVar2;
  shared_ptr<anurbs::EntryBase> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  shared_ptr<anurbs::EntryBase> local_60;
  pointer local_50;
  pointer local_48;
  undefined4 local_40;
  undefined1 local_3c;
  
  (__return_storage_ptr__->
  super__Vector_base<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->m_entry_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_entry_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      get_type_abi_cxx11_((string *)&local_70,this,index);
      local_40 = 0x70657242;
      local_48 = (pointer)0x4;
      local_3c = 0;
      bVar2 = true;
      local_50 = (pointer)&local_40;
      if (local_68 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4) {
        iVar1 = bcmp(local_70,&local_40,4);
        bVar2 = iVar1 != 0;
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,(ulong)((long)&((__shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&(local_60.
                                                  super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->_vptr_EntryBase)->_M_ptr + 1));
      }
      if (!bVar2) {
        get<anurbs::Brep>((Model *)&local_70,(size_t)this);
        std::vector<anurbs::Ref<anurbs::Brep>,std::allocator<anurbs::Ref<anurbs::Brep>>>::
        emplace_back<anurbs::Ref<anurbs::Brep>>
                  ((vector<anurbs::Ref<anurbs::Brep>,std::allocator<anurbs::Ref<anurbs::Brep>>> *)
                   __return_storage_ptr__,(Ref<anurbs::Brep> *)&local_70);
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
      }
      index = index + 1;
    } while (index < (ulong)((long)(this->m_entry_map).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_entry_map).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ref<TData>> of_type() const
    {
        std::vector<Ref<TData>> list;

        for (size_t i = 0; i < nb_entries(); i++) {
            if (get_type(i) != TData::type_name()) {
                continue;
            }
            list.push_back(get<TData>(i));
        }

        return list;
    }